

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_zone.cpp
# Opt level: O0

void __thiscall
sf2cute::SFInstrumentZone::set_sample(SFInstrumentZone *this,weak_ptr<sf2cute::SFSample> *sample)

{
  bool bVar1;
  SoundFont *this_00;
  shared_ptr<sf2cute::SFSample> local_28;
  weak_ptr<sf2cute::SFSample> *local_18;
  weak_ptr<sf2cute::SFSample> *sample_local;
  SFInstrumentZone *this_local;
  
  local_18 = sample;
  sample_local = (weak_ptr<sf2cute::SFSample> *)this;
  bVar1 = has_parent_file(this);
  if ((bVar1) &&
     (bVar1 = std::__weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>::expired
                        (&sample->super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>),
     !bVar1)) {
    this_00 = parent_file(this);
    std::weak_ptr<sf2cute::SFSample>::lock((weak_ptr<sf2cute::SFSample> *)&local_28);
    SoundFont::AddSample(this_00,&local_28);
    std::shared_ptr<sf2cute::SFSample>::~shared_ptr(&local_28);
  }
  std::weak_ptr<sf2cute::SFSample>::operator=(&this->sample_,sample);
  return;
}

Assistant:

void SFInstrumentZone::set_sample(std::weak_ptr<SFSample> sample) {
  if (has_parent_file() && !sample.expired()) {
    parent_file().AddSample(sample.lock());
  }
  sample_ = std::move(sample);
}